

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265_stream.cpp
# Opt level: O1

void h265_read_vps_rbsp(h265_stream_t *h,bs_t *b)

{
  vector<int,_std::allocator<int>_> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  byte bVar1;
  h265_vps_t *__s;
  byte *pbVar2;
  videoinfo_t *pvVar3;
  uint32_t r_4;
  int iVar4;
  byte *pbVar5;
  pointer pvVar6;
  int iVar7;
  uint32_t r_1;
  uint32_t r;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  
  pbVar5 = b->p;
  uVar11 = b->bits_left;
  uVar14 = 0;
  iVar7 = 3;
  do {
    uVar11 = uVar11 - 1;
    b->bits_left = uVar11;
    uVar8 = 0;
    if (pbVar5 < b->end) {
      uVar8 = (uint)((*pbVar5 >> (uVar11 & 0x1f) & 1) != 0);
    }
    if (uVar11 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar11 = 8;
    }
    uVar8 = (uint)uVar14 | uVar8 << ((byte)iVar7 & 0x1f);
    uVar14 = (ulong)uVar8;
    bVar18 = iVar7 != 0;
    iVar7 = iVar7 + -1;
  } while (bVar18);
  __s = h->vps_table[uVar14];
  h->vps = __s;
  bVar18 = false;
  memset(__s,0,0x4f0);
  __s->vps_video_parameter_set_id = (uint8_t)uVar8;
  uVar11 = b->bits_left - 1;
  b->bits_left = uVar11;
  pbVar5 = b->p;
  pbVar2 = b->end;
  if (pbVar5 < pbVar2) {
    bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) != 0;
  }
  if (uVar11 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  __s->vps_base_layer_internal_flag = bVar18;
  uVar11 = b->bits_left - 1;
  b->bits_left = uVar11;
  pbVar5 = b->p;
  if (pbVar5 < pbVar2) {
    bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) != 0;
  }
  else {
    bVar18 = false;
  }
  if (uVar11 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  __s->vps_base_layer_available_flag = bVar18;
  uVar11 = b->bits_left;
  pbVar5 = b->p;
  uVar8 = 0;
  iVar7 = 5;
  do {
    uVar11 = uVar11 - 1;
    b->bits_left = uVar11;
    uVar12 = 0;
    if (pbVar5 < pbVar2) {
      uVar12 = (uint)((*pbVar5 >> (uVar11 & 0x1f) & 1) != 0);
    }
    if (uVar11 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar11 = 8;
    }
    uVar8 = uVar8 | uVar12 << ((byte)iVar7 & 0x1f);
    bVar18 = iVar7 != 0;
    iVar7 = iVar7 + -1;
  } while (bVar18);
  __s->vps_max_layers_minus1 = (uint8_t)uVar8;
  uVar11 = b->bits_left;
  pbVar5 = b->p;
  uVar8 = 0;
  iVar7 = 2;
  do {
    uVar11 = uVar11 - 1;
    b->bits_left = uVar11;
    uVar12 = 0;
    if (pbVar5 < pbVar2) {
      uVar12 = (uint)((*pbVar5 >> (uVar11 & 0x1f) & 1) != 0);
    }
    if (uVar11 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar11 = 8;
    }
    uVar8 = uVar8 | uVar12 << ((byte)iVar7 & 0x1f);
    bVar18 = iVar7 != 0;
    iVar7 = iVar7 + -1;
  } while (bVar18);
  __s->vps_max_sub_layers_minus1 = (uint8_t)uVar8;
  uVar11 = b->bits_left - 1;
  b->bits_left = uVar11;
  pbVar5 = b->p;
  if (pbVar5 < pbVar2) {
    bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) != 0;
  }
  else {
    bVar18 = false;
  }
  if (uVar11 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  __s->vps_temporal_id_nesting_flag = bVar18;
  uVar11 = b->bits_left;
  pbVar5 = b->p;
  uVar12 = 0;
  iVar7 = 0xf;
  do {
    uVar11 = uVar11 - 1;
    b->bits_left = uVar11;
    uVar15 = 0;
    if (pbVar5 < pbVar2) {
      uVar15 = (uint)((*pbVar5 >> (uVar11 & 0x1f) & 1) != 0);
    }
    if (uVar11 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar11 = 8;
    }
    uVar12 = uVar12 | uVar15 << ((byte)iVar7 & 0x1f);
    bVar18 = iVar7 != 0;
    iVar7 = iVar7 + -1;
  } while (bVar18);
  __s->vps_reserved_0xffff_16bits = uVar12;
  h265_read_ptl(&__s->ptl,b,1,uVar8 & 0xff);
  pvVar3 = h->info;
  pvVar3->profile_idc = (uint)(__s->ptl).general_profile_idc;
  pvVar3->level_idc = (uint)(__s->ptl).general_level_idc;
  pvVar3->tier_idc = (uint)(__s->ptl).general_tier_flag;
  uVar11 = b->bits_left - 1;
  b->bits_left = uVar11;
  pbVar5 = b->p;
  pbVar2 = b->end;
  bVar18 = false;
  if (pbVar5 < pbVar2) {
    bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) != 0;
  }
  if (uVar11 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  __s->vps_sub_layer_ordering_info_present_flag = bVar18;
  uVar11 = 0;
  if (!bVar18) {
    uVar11 = (uint)__s->vps_max_sub_layers_minus1;
  }
  bVar1 = __s->vps_max_sub_layers_minus1;
  if (uVar11 <= bVar1) {
    pbVar5 = b->p;
    uVar14 = (ulong)uVar11;
    do {
      uVar8 = b->bits_left;
      uVar11 = 0xffffffff;
      iVar7 = -2;
      do {
        iVar4 = iVar7;
        uVar12 = uVar11;
        uVar8 = uVar8 - 1;
        b->bits_left = uVar8;
        bVar18 = true;
        if (pbVar5 < pbVar2) {
          bVar18 = (*pbVar5 >> (uVar8 & 0x1f) & 1) == 0;
        }
        if (uVar8 == 0) {
          pbVar5 = pbVar5 + 1;
          b->p = pbVar5;
          b->bits_left = 8;
          uVar8 = 8;
        }
        uVar11 = uVar12 + 1;
      } while (((bool)(bVar18 & uVar11 < 0x20)) && (iVar7 = iVar4 + 1, pbVar5 < pbVar2));
      if (uVar11 == 0) {
        uVar8 = 0;
      }
      else {
        uVar15 = b->bits_left;
        uVar8 = 0;
        do {
          uVar15 = uVar15 - 1;
          b->bits_left = uVar15;
          uVar9 = 0;
          if (pbVar5 < pbVar2) {
            uVar9 = (uint)((*pbVar5 >> (uVar15 & 0x1f) & 1) != 0);
          }
          if (uVar15 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar15 = 8;
          }
          uVar8 = uVar8 | uVar9 << ((byte)uVar12 & 0x1f);
          uVar12 = uVar12 - 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != -2);
      }
      __s->vps_max_dec_pic_buffering_minus1[uVar14] = ~(-1 << ((byte)uVar11 & 0x1f)) + uVar8;
      uVar11 = b->bits_left;
      uVar8 = 0xffffffff;
      iVar7 = -2;
      do {
        iVar4 = iVar7;
        uVar12 = uVar8;
        uVar11 = uVar11 - 1;
        b->bits_left = uVar11;
        bVar18 = true;
        if (pbVar5 < pbVar2) {
          bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) == 0;
        }
        if (uVar11 == 0) {
          pbVar5 = pbVar5 + 1;
          b->p = pbVar5;
          b->bits_left = 8;
          uVar11 = 8;
        }
        uVar8 = uVar12 + 1;
      } while (((bool)(bVar18 & uVar8 < 0x20)) && (iVar7 = iVar4 + 1, pbVar5 < pbVar2));
      if (uVar8 == 0) {
        uVar11 = 0;
      }
      else {
        uVar15 = b->bits_left;
        uVar11 = 0;
        do {
          uVar15 = uVar15 - 1;
          b->bits_left = uVar15;
          uVar9 = 0;
          if (pbVar5 < pbVar2) {
            uVar9 = (uint)((*pbVar5 >> (uVar15 & 0x1f) & 1) != 0);
          }
          if (uVar15 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar15 = 8;
          }
          uVar11 = uVar11 | uVar9 << ((byte)uVar12 & 0x1f);
          uVar12 = uVar12 - 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != -2);
      }
      __s->vps_max_num_reorder_pics[uVar14] = ~(-1 << ((byte)uVar8 & 0x1f)) + uVar11;
      uVar8 = b->bits_left;
      uVar11 = 0xffffffff;
      iVar7 = -2;
      do {
        iVar4 = iVar7;
        uVar12 = uVar11;
        uVar8 = uVar8 - 1;
        b->bits_left = uVar8;
        bVar18 = true;
        if (pbVar5 < pbVar2) {
          bVar18 = (*pbVar5 >> (uVar8 & 0x1f) & 1) == 0;
        }
        if (uVar8 == 0) {
          pbVar5 = pbVar5 + 1;
          b->p = pbVar5;
          b->bits_left = 8;
          uVar8 = 8;
        }
        uVar11 = uVar12 + 1;
      } while (((bool)(bVar18 & uVar11 < 0x20)) && (iVar7 = iVar4 + 1, pbVar5 < pbVar2));
      if (uVar11 == 0) {
        uVar8 = 0;
      }
      else {
        uVar15 = b->bits_left;
        uVar8 = 0;
        do {
          uVar15 = uVar15 - 1;
          b->bits_left = uVar15;
          uVar9 = 0;
          if (pbVar5 < pbVar2) {
            uVar9 = (uint)((*pbVar5 >> (uVar15 & 0x1f) & 1) != 0);
          }
          if (uVar15 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar15 = 8;
          }
          uVar8 = uVar8 | uVar9 << ((byte)uVar12 & 0x1f);
          uVar12 = uVar12 - 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != -2);
      }
      __s->vps_max_latency_increase_plus1[uVar14] = ~(-1 << ((byte)uVar11 & 0x1f)) + uVar8;
      uVar14 = uVar14 + 1;
    } while (uVar14 != (ulong)bVar1 + 1);
  }
  uVar11 = b->bits_left;
  pbVar5 = b->p;
  uVar8 = 0;
  iVar7 = 5;
  do {
    uVar11 = uVar11 - 1;
    b->bits_left = uVar11;
    uVar12 = 0;
    if (pbVar5 < pbVar2) {
      uVar12 = (uint)((*pbVar5 >> (uVar11 & 0x1f) & 1) != 0);
    }
    if (uVar11 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar11 = 8;
    }
    uVar8 = uVar8 | uVar12 << ((byte)iVar7 & 0x1f);
    bVar18 = iVar7 != 0;
    iVar7 = iVar7 + -1;
  } while (bVar18);
  __s->vps_max_layer_id = (uint8_t)uVar8;
  uVar11 = b->bits_left;
  pbVar5 = b->p;
  uVar8 = 0xffffffff;
  iVar7 = 0;
  do {
    uVar11 = uVar11 - 1;
    b->bits_left = uVar11;
    bVar18 = true;
    if (pbVar5 < pbVar2) {
      bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) == 0;
    }
    if (uVar11 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar11 = 8;
    }
    uVar8 = uVar8 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar18 & uVar8 < 0x20)) && (pbVar5 < pbVar2));
  if (iVar7 == -1) {
    uVar11 = 0;
  }
  else {
    iVar4 = -2 - iVar7;
    iVar13 = -3 - iVar7;
    uVar8 = b->bits_left;
    pbVar5 = b->p;
    uVar11 = 0;
    do {
      uVar8 = uVar8 - 1;
      b->bits_left = uVar8;
      uVar12 = 0;
      if (pbVar5 < pbVar2) {
        uVar12 = (uint)((*pbVar5 >> (uVar8 & 0x1f) & 1) != 0);
      }
      if (uVar8 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar8 = 8;
      }
      uVar11 = uVar11 | uVar12 << ((byte)iVar4 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar4 = iVar4 + -1;
    } while (iVar13 != -2);
  }
  uVar8 = -1 << (~(byte)iVar7 & 0x1f);
  __s->vps_num_layer_sets_minus1 = ~uVar8 + uVar11;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::resize(&__s->layer_id_included_flag,(long)(int)(uVar11 - uVar8));
  pvVar6 = (__s->layer_id_included_flag).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((__s->layer_id_included_flag).
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar6) {
    uVar14 = 0;
    uVar10 = 1;
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (pvVar6 + uVar14,(ulong)__s->vps_max_layer_id);
      pvVar6 = (__s->layer_id_included_flag).
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((long)(__s->layer_id_included_flag).
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
               -0x5555555555555555;
      bVar18 = uVar10 <= uVar14;
      lVar16 = uVar14 - uVar10;
      uVar14 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar18 && lVar16 != 0);
  }
  uVar14 = (ulong)(uint)__s->vps_num_layer_sets_minus1;
  if (0 < __s->vps_num_layer_sets_minus1) {
    lVar17 = 0x18;
    lVar16 = 0;
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&(((__s->layer_id_included_flag).
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data + lVar17),(long)((int)uVar14 + 1));
      uVar14 = (ulong)__s->vps_num_layer_sets_minus1;
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x18;
    } while (lVar16 < (long)uVar14);
  }
  if (0 < __s->vps_num_layer_sets_minus1) {
    lVar16 = 1;
    do {
      uVar14 = 0xffffffffffffffff;
      do {
        uVar11 = b->bits_left - 1;
        b->bits_left = uVar11;
        pbVar5 = b->p;
        if (pbVar5 < b->end) {
          bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) != 0;
        }
        else {
          bVar18 = false;
        }
        if (uVar11 == 0) {
          b->p = pbVar5 + 1;
          b->bits_left = 8;
        }
        *(bool *)(*(long *)&(__s->layer_id_included_flag).
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar16].
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data + 1 + uVar14) = bVar18;
        uVar14 = uVar14 + 1;
      } while (uVar14 < __s->vps_max_layer_id);
      bVar18 = lVar16 < __s->vps_num_layer_sets_minus1;
      lVar16 = lVar16 + 1;
    } while (bVar18);
  }
  uVar11 = b->bits_left - 1;
  b->bits_left = uVar11;
  pbVar5 = b->p;
  pbVar2 = b->end;
  bVar18 = false;
  if (pbVar5 < pbVar2) {
    bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) != 0;
  }
  if (uVar11 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  __s->vps_timing_info_present_flag = bVar18;
  if (bVar18) {
    uVar11 = b->bits_left;
    pbVar5 = b->p;
    uVar8 = 0;
    iVar7 = 0x1f;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar12 = 0;
      if (pbVar5 < pbVar2) {
        uVar12 = (uint)((*pbVar5 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar8 = uVar8 | uVar12 << ((byte)iVar7 & 0x1f);
      bVar18 = iVar7 != 0;
      iVar7 = iVar7 + -1;
    } while (bVar18);
    __s->vps_num_units_in_tick = uVar8;
    uVar11 = b->bits_left;
    pbVar5 = b->p;
    uVar8 = 0;
    iVar7 = 0x1f;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar12 = 0;
      if (pbVar5 < pbVar2) {
        uVar12 = (uint)((*pbVar5 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar8 = uVar8 | uVar12 << ((byte)iVar7 & 0x1f);
      bVar18 = iVar7 != 0;
      iVar7 = iVar7 + -1;
    } while (bVar18);
    __s->vps_time_scale = uVar8;
    uVar11 = b->bits_left - 1;
    b->bits_left = uVar11;
    pbVar5 = b->p;
    bVar18 = false;
    if (pbVar5 < pbVar2) {
      bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) != 0;
    }
    if (uVar11 == 0) {
      b->p = pbVar5 + 1;
      b->bits_left = 8;
    }
    __s->vps_poc_proportional_to_timing_flag = bVar18;
    if (bVar18) {
      uVar11 = b->bits_left;
      pbVar5 = b->p;
      uVar8 = 0xffffffff;
      iVar7 = 0;
      do {
        uVar11 = uVar11 - 1;
        b->bits_left = uVar11;
        bVar18 = true;
        if (pbVar5 < pbVar2) {
          bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) == 0;
        }
        if (uVar11 == 0) {
          pbVar5 = pbVar5 + 1;
          b->p = pbVar5;
          b->bits_left = 8;
          uVar11 = 8;
        }
        uVar8 = uVar8 + 1;
        iVar7 = iVar7 + -1;
      } while (((bool)(bVar18 & uVar8 < 0x20)) && (pbVar5 < pbVar2));
      if (iVar7 == -1) {
        uVar11 = 0;
      }
      else {
        iVar4 = -2 - iVar7;
        iVar13 = -3 - iVar7;
        uVar8 = b->bits_left;
        pbVar5 = b->p;
        uVar11 = 0;
        do {
          uVar8 = uVar8 - 1;
          b->bits_left = uVar8;
          uVar12 = 0;
          if (pbVar5 < pbVar2) {
            uVar12 = (uint)((*pbVar5 >> (uVar8 & 0x1f) & 1) != 0);
          }
          if (uVar8 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar8 = 8;
          }
          uVar11 = uVar11 | uVar12 << ((byte)iVar4 & 0x1f);
          iVar13 = iVar13 + -1;
          iVar4 = iVar4 + -1;
        } while (iVar13 != -2);
      }
      __s->vps_num_ticks_poc_diff_one_minus1 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar11;
    }
    uVar11 = b->bits_left;
    pbVar5 = b->p;
    uVar8 = 0xffffffff;
    iVar7 = 0;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      bVar18 = true;
      if (pbVar5 < pbVar2) {
        bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) == 0;
      }
      if (uVar11 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar18 & uVar8 < 0x20)) && (pbVar5 < pbVar2));
    if (iVar7 == -1) {
      uVar11 = 0;
    }
    else {
      iVar4 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar8 = b->bits_left;
      pbVar5 = b->p;
      uVar11 = 0;
      do {
        uVar8 = uVar8 - 1;
        b->bits_left = uVar8;
        uVar12 = 0;
        if (pbVar5 < pbVar2) {
          uVar12 = (uint)((*pbVar5 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar5 = pbVar5 + 1;
          b->p = pbVar5;
          b->bits_left = 8;
          uVar8 = 8;
        }
        uVar11 = uVar11 | uVar12 << ((byte)iVar4 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar4 = iVar4 + -1;
      } while (iVar13 != -2);
    }
    iVar7 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar11;
    __s->vps_num_hrd_parameters = iVar7;
    this = &__s->hrd_layer_set_idx;
    std::vector<int,_std::allocator<int>_>::resize(this,(long)iVar7);
    this_00 = &__s->cprms_present_flag;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (this_00,(long)__s->vps_num_hrd_parameters);
    std::vector<int,_std::allocator<int>_>::resize(this,(long)__s->vps_num_hrd_parameters);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (this_00,(long)__s->vps_num_hrd_parameters);
    if (0 < __s->vps_num_hrd_parameters) {
      lVar16 = 0;
      do {
        pbVar5 = b->p;
        pbVar2 = b->end;
        uVar11 = b->bits_left;
        uVar8 = 0xffffffff;
        iVar7 = -2;
        do {
          iVar4 = iVar7;
          uVar12 = uVar8;
          uVar11 = uVar11 - 1;
          b->bits_left = uVar11;
          bVar18 = true;
          if (pbVar5 < pbVar2) {
            bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) == 0;
          }
          if (uVar11 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar11 = 8;
          }
          uVar8 = uVar12 + 1;
        } while (((bool)(bVar18 & uVar8 < 0x20)) && (iVar7 = iVar4 + 1, pbVar5 < pbVar2));
        if (uVar8 == 0) {
          uVar11 = 0;
        }
        else {
          uVar15 = b->bits_left;
          pbVar5 = b->p;
          uVar11 = 0;
          do {
            uVar15 = uVar15 - 1;
            b->bits_left = uVar15;
            uVar9 = 0;
            if (pbVar5 < pbVar2) {
              uVar9 = (uint)((*pbVar5 >> (uVar15 & 0x1f) & 1) != 0);
            }
            if (uVar15 == 0) {
              pbVar5 = pbVar5 + 1;
              b->p = pbVar5;
              b->bits_left = 8;
              uVar15 = 8;
            }
            uVar11 = uVar11 | uVar9 << ((byte)uVar12 & 0x1f);
            uVar12 = uVar12 - 1;
            iVar4 = iVar4 + -1;
          } while (iVar4 != -2);
        }
        (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar16] = ~(-1 << ((byte)uVar8 & 0x1f)) + uVar11;
        if (lVar16 != 0) {
          uVar11 = b->bits_left - 1;
          b->bits_left = uVar11;
          pbVar5 = b->p;
          if (pbVar5 < pbVar2) {
            bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) != 0;
          }
          else {
            bVar18 = false;
          }
          if (uVar11 == 0) {
            b->p = pbVar5 + 1;
            b->bits_left = 8;
          }
          (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar16] = bVar18;
        }
        h265_read_hrd_parameters
                  (&__s->hrd_parameters,b,
                   (uint)(__s->cprms_present_flag).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16],
                   (uint)__s->vps_max_sub_layers_minus1);
        lVar16 = lVar16 + 1;
      } while (lVar16 < __s->vps_num_hrd_parameters);
    }
  }
  uVar11 = b->bits_left - 1;
  b->bits_left = uVar11;
  pbVar5 = b->p;
  pbVar2 = b->end;
  bVar18 = false;
  if (pbVar5 < pbVar2) {
    bVar18 = (*pbVar5 >> (uVar11 & 0x1f) & 1) != 0;
  }
  if (uVar11 == 0) {
    b->p = pbVar5 + 1;
    b->bits_left = 8;
  }
  __s->vps_extension_flag = bVar18;
  if ((bVar18) && (pbVar5 = b->p, pbVar5 < pbVar2)) {
    iVar7 = b->bits_left;
    do {
      iVar7 = iVar7 + -1;
      if (iVar7 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        iVar7 = 8;
      }
    } while (pbVar5 < pbVar2);
    b->bits_left = iVar7;
  }
  h265_read_rbsp_trailing_bits(b);
  return;
}

Assistant:

void  h265_read_vps_rbsp(h265_stream_t* h, bs_t* b)
{
    int i = 0;
    int j = 0;

    int vps_video_parameter_set_id  = bs_read_u(b, 4);
    // 选择正确的sps表
    h->vps = h->vps_table[vps_video_parameter_set_id];
    h265_vps_t* vps = h->vps;
    memset(vps, 0, sizeof(h265_vps_t));

    vps->vps_video_parameter_set_id    = vps_video_parameter_set_id;
    vps->vps_base_layer_internal_flag  = bs_read_u1(b);
    vps->vps_base_layer_available_flag = bs_read_u1(b);
    vps->vps_max_layers_minus1         = bs_read_u(b, 6);
    vps->vps_max_sub_layers_minus1     = bs_read_u(b, 3);
    vps->vps_temporal_id_nesting_flag  = bs_read_u1(b);
    vps->vps_reserved_0xffff_16bits    = bs_read_u(b, 16);

    // profile tier level...
    h265_read_ptl(&vps->ptl, b, 1, vps->vps_max_sub_layers_minus1);
    h->info->profile_idc = vps->ptl.general_profile_idc;
    h->info->level_idc   = vps->ptl.general_level_idc;
    h->info->tier_idc    = vps->ptl.general_tier_flag;

    vps->vps_sub_layer_ordering_info_present_flag = bs_read_u1(b);
    for (i = (vps->vps_sub_layer_ordering_info_present_flag ? 0 : vps->vps_max_sub_layers_minus1);
         i <= vps->vps_max_sub_layers_minus1; i++ )
    {
        vps->vps_max_dec_pic_buffering_minus1[i] = bs_read_ue(b);
        vps->vps_max_num_reorder_pics[i]         = bs_read_ue(b);
        vps->vps_max_latency_increase_plus1[i]   = bs_read_ue(b);
    }
    vps->vps_max_layer_id           = bs_read_u(b, 6);
    vps->vps_num_layer_sets_minus1  = bs_read_ue(b);
    vps->layer_id_included_flag.resize(vps->vps_num_layer_sets_minus1+1);
    for (unsigned int k = 0; k < vps->layer_id_included_flag.size(); k++)
    {
        vps->layer_id_included_flag[k].resize(vps->vps_max_layer_id);
    }
    for (i = 1; i <= vps->vps_num_layer_sets_minus1; i++)
    {
        vps->layer_id_included_flag[i].resize(vps->vps_num_layer_sets_minus1+1);
    }
    for (i = 1; i <= vps->vps_num_layer_sets_minus1; i++)
    {
        for (j = 0; j <= vps->vps_max_layer_id; j++)
        {
            vps->layer_id_included_flag[i][j] = bs_read_u1(b);
        }
    }
    vps->vps_timing_info_present_flag = bs_read_u1(b);
    if (vps->vps_timing_info_present_flag)
    {
        vps->vps_num_units_in_tick = bs_read_u(b, 32);
        vps->vps_time_scale = bs_read_u(b, 32);
        vps->vps_poc_proportional_to_timing_flag = bs_read_u1(b);
        if (vps->vps_poc_proportional_to_timing_flag)
        {
            vps->vps_num_ticks_poc_diff_one_minus1 = bs_read_ue(b);
        }
        vps->vps_num_hrd_parameters  = bs_read_ue(b);
        vps->hrd_layer_set_idx.resize(vps->vps_num_hrd_parameters);
        vps->cprms_present_flag.resize(vps->vps_num_hrd_parameters);
        vps->hrd_layer_set_idx.resize(vps->vps_num_hrd_parameters);
        vps->cprms_present_flag.resize(vps->vps_num_hrd_parameters);
        for (i = 0; i < vps->vps_num_hrd_parameters; i++)
        {
            vps->hrd_layer_set_idx[i] = bs_read_ue(b);
            if (i > 0)
            {
                vps->cprms_present_flag[i] = bs_read_u1(b);
            }
            //  hrd_parameters()
            h265_read_hrd_parameters(&(vps->hrd_parameters), b, vps->cprms_present_flag[i], vps->vps_max_sub_layers_minus1);
        }
    }
    vps->vps_extension_flag  = bs_read_u1(b);
    if (vps->vps_extension_flag)
    {
        while (h265_more_rbsp_trailing_data(b))
        {
            int sps_extension_data_flag = bs_read_u1(b);
        }
    }
    h265_read_rbsp_trailing_bits(b);
}